

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O1

bool __thiscall PartiallyDownloadedBlock::IsTxAvailable(PartiallyDownloadedBlock *this,size_t index)

{
  pointer psVar1;
  long in_FS_OFFSET;
  bool bVar2;
  
  if ((this->header).nBits == 0) {
    bVar2 = false;
  }
  else {
    psVar1 = (this->txn_available).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->txn_available).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= index) {
      __assert_fail("index < txn_available.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
                    ,0xb3,"bool PartiallyDownloadedBlock::IsTxAvailable(size_t) const");
    }
    bVar2 = psVar1[index].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallyDownloadedBlock::IsTxAvailable(size_t index) const
{
    if (header.IsNull()) return false;

    assert(index < txn_available.size());
    return txn_available[index] != nullptr;
}